

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setToolTip(QGraphicsItem *this,QString *toolTip)

{
  QGraphicsItemPrivate *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QVariant toolTipVariant;
  QVariant *in_stack_ffffffffffffff40;
  QVariant *this_00;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  undefined1 local_a0 [24];
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(&local_48,(QString *)in_RSI);
  this_01 = &local_28;
  (**(code **)(*in_RDI + 0x108))(this_01,in_RDI,0x13,&local_48);
  ::QVariant::~QVariant(&local_48);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RDI + 1));
  ::QVariant::toString();
  ::QVariant::QVariant(&local_68,(QString *)local_a0);
  QGraphicsItemPrivate::setExtra(in_RSI,(Extra)((ulong)this_01 >> 0x20),in_stack_ffffffffffffff40);
  ::QVariant::~QVariant(&local_68);
  QString::~QString((QString *)0x97a927);
  this_00 = &local_88;
  (**(code **)(*in_RDI + 0x108))(this_00,in_RDI,0x14,this_01);
  ::QVariant::~QVariant(this_00);
  ::QVariant::~QVariant((QVariant *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setToolTip(const QString &toolTip)
{
    const QVariant toolTipVariant(itemChange(ItemToolTipChange, toolTip));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraToolTip, toolTipVariant.toString());
    itemChange(ItemToolTipHasChanged, toolTipVariant);
}